

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s5.c
# Opt level: O1

s5_err s5_parse(s5_ctx *cx,uint8_t **data,size_t *size)

{
  byte bVar1;
  uint uVar2;
  uint8_t *puVar3;
  size_t sVar4;
  s5_err sVar5;
  byte bVar6;
  size_t sVar7;
  uint8_t uVar8;
  size_t sVar9;
  byte bVar10;
  uint uVar11;
  bool bVar12;
  
  puVar3 = *data;
  sVar4 = *size;
  if (sVar4 == 0) {
    sVar5 = s5_ok;
    sVar9 = 0;
    goto LAB_0010fed2;
  }
  bVar6 = cx->state;
  sVar9 = 0;
  sVar7 = 1;
LAB_0010fc3b:
  if (0x10 < bVar6) {
    abort();
  }
  bVar10 = puVar3[sVar7 - 1];
  uVar11 = (uint)bVar10;
  sVar9 = sVar9 + 1;
  switch(bVar6) {
  case 0:
    if (bVar10 != 5) {
      sVar5 = s5_bad_version;
      sVar9 = sVar7;
      goto LAB_0010fed2;
    }
    cx->state = '\x01';
    bVar6 = 1;
    break;
  case 1:
    cx->arg0 = 0;
    cx->arg1 = uVar11;
    cx->state = '\x02';
    bVar6 = 2;
    break;
  case 2:
    if (cx->arg0 < cx->arg1) {
      if (uVar11 == 0) {
        bVar10 = 1;
LAB_0010fe56:
        cx->methods = cx->methods | bVar10;
      }
      else {
        if (uVar11 == 2) {
          bVar10 = 4;
          goto LAB_0010fe56;
        }
        if (uVar11 == 1) {
          bVar10 = 2;
          goto LAB_0010fe56;
        }
      }
      cx->arg0 = cx->arg0 + 1;
    }
    if (cx->arg0 == cx->arg1) {
      sVar5 = s5_auth_select;
      goto LAB_0010fed2;
    }
    break;
  case 3:
    if (bVar10 != 1) {
LAB_0010fe86:
      sVar5 = s5_bad_version;
      goto LAB_0010fed2;
    }
    cx->state = '\x04';
    bVar6 = 4;
    break;
  case 4:
    cx->arg0 = 0;
    cx->userlen = bVar10;
    cx->state = '\x05';
    bVar6 = 5;
    break;
  case 5:
    uVar11 = cx->arg0;
    bVar1 = cx->userlen;
    if (uVar11 < bVar1) {
      cx->username[uVar11] = bVar10;
      cx->arg0 = uVar11 + 1;
    }
    if (cx->arg0 == (uint)bVar1) {
      cx->username[bVar1] = '\0';
      cx->state = '\x06';
      bVar6 = 6;
    }
    break;
  case 6:
    cx->arg0 = 0;
    cx->passlen = bVar10;
    cx->state = '\a';
    bVar6 = 7;
    break;
  case 7:
    uVar11 = cx->arg0;
    bVar1 = cx->passlen;
    if (uVar11 < bVar1) {
      cx->password[uVar11] = bVar10;
      cx->arg0 = uVar11 + 1;
    }
    if (cx->arg0 == (uint)bVar1) {
      cx->password[bVar1] = '\0';
      sVar5 = s5_auth_verify;
      uVar8 = '\b';
      goto LAB_0010feb6;
    }
    break;
  case 8:
    if (bVar10 != 5) goto LAB_0010fe86;
    cx->state = '\t';
    bVar6 = 9;
    break;
  case 9:
    if (uVar11 == 3) {
      cx->cmd = '\x02';
    }
    else {
      if (uVar11 != 1) {
        sVar5 = s5_bad_cmd;
        goto LAB_0010fed2;
      }
      cx->cmd = '\0';
    }
    cx->state = '\n';
    bVar6 = 10;
    break;
  case 10:
    cx->state = '\v';
    bVar6 = 0xb;
    break;
  case 0xb:
    cx->arg0 = 0;
    if (uVar11 != 4) {
      if (uVar11 == 3) {
        cx->state = '\f';
        cx->atyp = '\x02';
        cx->arg1 = 0;
        bVar6 = 0xc;
        break;
      }
      if (uVar11 == 1) {
        cx->state = '\r';
        cx->atyp = '\0';
        cx->arg1 = 4;
        goto LAB_0010fe4a;
      }
      sVar5 = s5_bad_atyp;
      goto LAB_0010fed2;
    }
    cx->state = '\r';
    cx->atyp = '\x01';
    cx->arg1 = 0x10;
    goto LAB_0010fe4a;
  case 0xc:
    cx->arg1 = uVar11;
    cx->state = '\r';
LAB_0010fe4a:
    bVar6 = 0xd;
    break;
  case 0xd:
    uVar11 = cx->arg0;
    uVar2 = cx->arg1;
    if (uVar11 < uVar2) {
      cx->daddr[uVar11] = bVar10;
      cx->arg0 = uVar11 + 1;
    }
    if (cx->arg0 == uVar2) {
      cx->daddr[uVar2] = '\0';
      cx->state = '\x0e';
      bVar6 = 0xe;
    }
    break;
  case 0xe:
    cx->dport = (ushort)bVar10 << 8;
    cx->state = '\x0f';
    bVar6 = 0xf;
    break;
  case 0xf:
    cx->dport = cx->dport | (ushort)bVar10;
    sVar5 = s5_exec_cmd;
    uVar8 = '\x10';
LAB_0010feb6:
    cx->state = uVar8;
    sVar9 = sVar7;
    goto LAB_0010fed2;
  }
  bVar12 = sVar7 == sVar4;
  sVar7 = sVar7 + 1;
  if (bVar12) goto code_r0x0010fe78;
  goto LAB_0010fc3b;
code_r0x0010fe78:
  sVar5 = s5_ok;
  sVar9 = sVar4;
LAB_0010fed2:
  *data = puVar3 + sVar9;
  *size = sVar4 - sVar9;
  return sVar5;
}

Assistant:

s5_err s5_parse(s5_ctx *cx, uint8_t **data, size_t *size) {
  s5_err err;
  uint8_t *p;
  uint8_t c;
  size_t i;
  size_t n;

  p = *data;
  n = *size;
  i = 0;

  while (i < n) {
    c = p[i];
    i += 1;
    switch (cx->state) {
      case s5_version:
        if (c != 5) {
          err = s5_bad_version;
          goto out;
        }
        cx->state = s5_nmethods;
        break;

      case s5_nmethods:
        cx->arg0 = 0;
        cx->arg1 = c;  /* Number of bytes to read. */
        cx->state = s5_methods;
        break;

      case s5_methods:
        if (cx->arg0 < cx->arg1) {
          switch (c) {
            case 0:
              cx->methods |= S5_AUTH_NONE;
              break;
            case 1:
              cx->methods |= S5_AUTH_GSSAPI;
              break;
            case 2:
              cx->methods |= S5_AUTH_PASSWD;
              break;
            /* Ignore everything we don't understand. */
          }
          cx->arg0 += 1;
        }
        if (cx->arg0 == cx->arg1) {
          err = s5_auth_select;
          goto out;
        }
        break;

      case s5_auth_pw_version:
        if (c != 1) {
          err = s5_bad_version;
          goto out;
        }
        cx->state = s5_auth_pw_userlen;
        break;

      case s5_auth_pw_userlen:
        cx->arg0 = 0;
        cx->userlen = c;
        cx->state = s5_auth_pw_username;
        break;

      case s5_auth_pw_username:
        if (cx->arg0 < cx->userlen) {
          cx->username[cx->arg0] = c;
          cx->arg0 += 1;
        }
        if (cx->arg0 == cx->userlen) {
          cx->username[cx->userlen] = '\0';
          cx->state = s5_auth_pw_passlen;
        }
        break;

      case s5_auth_pw_passlen:
        cx->arg0 = 0;
        cx->passlen = c;
        cx->state = s5_auth_pw_password;
        break;

      case s5_auth_pw_password:
        if (cx->arg0 < cx->passlen) {
          cx->password[cx->arg0] = c;
          cx->arg0 += 1;
        }
        if (cx->arg0 == cx->passlen) {
          cx->password[cx->passlen] = '\0';
          cx->state = s5_req_version;
          err = s5_auth_verify;
          goto out;
        }
        break;

      case s5_req_version:
        if (c != 5) {
          err = s5_bad_version;
          goto out;
        }
        cx->state = s5_req_cmd;
        break;

      case s5_req_cmd:
        switch (c) {
          case 1:  /* TCP connect */
            cx->cmd = s5_cmd_tcp_connect;
            break;
          case 3:  /* UDP associate */
            cx->cmd = s5_cmd_udp_assoc;
            break;
          default:
            err = s5_bad_cmd;
            goto out;
        }
        cx->state = s5_req_reserved;
        break;

      case s5_req_reserved:
        cx->state = s5_req_atyp;
        break;

      case s5_req_atyp:
        cx->arg0 = 0;
        switch (c) {
          case 1:  /* IPv4, four octets. */
            cx->state = s5_req_daddr;
            cx->atyp = s5_atyp_ipv4;
            cx->arg1 = 4;
            break;
          case 3:  /* Hostname.  First byte is length. */
            cx->state = s5_req_atyp_host;
            cx->atyp = s5_atyp_host;
            cx->arg1 = 0;
            break;
          case 4:  /* IPv6, sixteen octets. */
            cx->state = s5_req_daddr;
            cx->atyp = s5_atyp_ipv6;
            cx->arg1 = 16;
            break;
          default:
            err = s5_bad_atyp;
            goto out;
        }
        break;

      case s5_req_atyp_host:
        cx->arg1 = c;
        cx->state = s5_req_daddr;
        break;

      case s5_req_daddr:
        if (cx->arg0 < cx->arg1) {
          cx->daddr[cx->arg0] = c;
          cx->arg0 += 1;
        }
        if (cx->arg0 == cx->arg1) {
          cx->daddr[cx->arg1] = '\0';
          cx->state = s5_req_dport0;
        }
        break;

      case s5_req_dport0:
        cx->dport = c << 8;
        cx->state = s5_req_dport1;
        break;

      case s5_req_dport1:
        cx->dport |= c;
        cx->state = s5_dead;
        err = s5_exec_cmd;
        goto out;

      case s5_dead:
        break;

      default:
        abort();
    }
  }
  err = s5_ok;

out:
  *data = p + i;
  *size = n - i;
  return err;
}